

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int __thiscall MovDemuxer::mov_read_udta_string(MovDemuxer *this,MOVAtom atom)

{
  undefined1 auVar1 [23];
  uint16_t uVar2;
  mapped_type *this_00;
  long lVar3;
  uint local_48c;
  uint local_488;
  uint local_47c;
  allocator<char> local_451;
  key_type local_450;
  uint local_42c;
  uint local_428;
  uint tag;
  uint data_size;
  uint str_size;
  char language [4];
  char key [4];
  char str [1024];
  MovDemuxer *this_local;
  
  auVar1 = (undefined1  [23])atom._1_23_;
  memset(language,0,0x400);
  memset(&str_size,0,4);
  memset(&data_size,0,4);
  atom._1_23_ = auVar1;
  if (this->itunes_metadata == 0) {
    uVar2 = IOContextDemuxer::get_be16(&this->super_IOContextDemuxer);
    tag = (uint)uVar2;
    uVar2 = IOContextDemuxer::get_be16(&this->super_IOContextDemuxer);
    ff_mov_lang_to_iso639((uint)uVar2,(char *)&data_size);
    lVar3 = atom.size + -4;
    atom.size = lVar3;
  }
  else {
    local_428 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    local_42c = IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
    if (local_42c != 0x61746164) {
      return 0;
    }
    IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    tag = local_428 - 0x10;
    lVar3 = atom.size + -0x10;
    atom.size = lVar3;
  }
  if (atom.size < 0) {
    this_local._4_4_ = -1;
  }
  else {
    str_size._0_1_ = atom.type._1_1_;
    str_size._1_1_ = atom.type._2_1_;
    str_size._2_1_ = atom.type._3_1_;
    if (tag < 0x3ff) {
      local_47c = tag;
    }
    else {
      local_47c = 0x3ff;
    }
    if (atom.size < (long)(ulong)local_47c) {
      local_488 = (uint)atom.size;
    }
    else {
      if (tag < 0x3ff) {
        local_48c = tag;
      }
      else {
        local_48c = 0x3ff;
      }
      local_488 = local_48c;
    }
    tag = local_488 & 0xffff;
    IOContextDemuxer::get_buffer(&this->super_IOContextDemuxer,(uint8_t *)language,tag);
    language[tag] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,(char *)&str_size,&local_451);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->metaData,&local_450);
    std::__cxx11::string::operator=((string *)this_00,language);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int MovDemuxer::mov_read_udta_string(MOVAtom atom)
{
    char str[1024]{}, key[4]{0}, language[4]{0};
    unsigned str_size;

    if (itunes_metadata)
    {
        const unsigned data_size = get_be32();
        const unsigned tag = get_le32();
        if (tag == MKTAG('d', 'a', 't', 'a'))
        {
            get_be32();  // type
            get_be32();  // unknown
            str_size = data_size - 16;
            atom.size -= 16;
        }
        else
            return 0;
    }
    else
    {
        str_size = get_be16();  // string length
        ff_mov_lang_to_iso639(get_be16(), language);
        atom.size -= 4;
    }
    if (atom.size < 0)
        return -1;

    key[0] = static_cast<char>(atom.type >> 8);
    key[1] = static_cast<char>(atom.type >> 16);
    key[2] = static_cast<char>(atom.type >> 24);

    str_size = static_cast<uint16_t>(FFMIN(FFMIN((int)(sizeof(str) - 1), str_size), atom.size));
    get_buffer(reinterpret_cast<uint8_t*>(str), str_size);
    str[str_size] = 0;
    metaData[key] = str;
    return 0;
}